

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall
TimerManager::addTimer(TimerManager *this,shared_ptr<HttpData> *SPHttpData,int timeout)

{
  TimerNode *this_00;
  element_type *this_01;
  shared_ptr<TimerNode> local_60;
  undefined1 local_4d;
  shared_ptr<HttpData> local_40;
  undefined1 local_30 [8];
  SPTimerNode new_node;
  int timeout_local;
  shared_ptr<HttpData> *SPHttpData_local;
  TimerManager *this_local;
  
  new_node.super___shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       timeout;
  this_00 = (TimerNode *)operator_new(0x20);
  local_4d = 1;
  std::shared_ptr<HttpData>::shared_ptr(&local_40,SPHttpData);
  TimerNode::TimerNode
            (this_00,&local_40,
             new_node.super___shared_ptr<TimerNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _4_4_);
  local_4d = 0;
  std::shared_ptr<TimerNode>::shared_ptr<TimerNode,void>((shared_ptr<TimerNode> *)local_30,this_00);
  std::shared_ptr<HttpData>::~shared_ptr(&local_40);
  std::
  priority_queue<std::shared_ptr<TimerNode>,_std::deque<std::shared_ptr<TimerNode>,_std::allocator<std::shared_ptr<TimerNode>_>_>,_TimerCmp>
  ::push(&this->timerNodeQueue,(value_type *)local_30);
  this_01 = std::__shared_ptr_access<HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<HttpData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       SPHttpData);
  std::shared_ptr<TimerNode>::shared_ptr(&local_60,(shared_ptr<TimerNode> *)local_30);
  HttpData::linkTimer(this_01,&local_60);
  std::shared_ptr<TimerNode>::~shared_ptr(&local_60);
  std::shared_ptr<TimerNode>::~shared_ptr((shared_ptr<TimerNode> *)local_30);
  return;
}

Assistant:

void TimerManager::addTimer(std::shared_ptr<HttpData> SPHttpData, int timeout) {
  SPTimerNode new_node(new TimerNode(SPHttpData, timeout));
  timerNodeQueue.push(new_node);
  SPHttpData->linkTimer(new_node);
}